

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

void __thiscall Al::al_exception::al_exception(al_exception *this,string *m,string *f,int l)

{
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *(undefined ***)this = &PTR__al_exception_00114cb8;
  std::__cxx11::string::string((string *)&this->msg,(string *)m);
  std::__cxx11::string::string((string *)&this->file,(string *)f);
  this->line = l;
  (this->err)._M_dataplus._M_p = (pointer)&(this->err).field_2;
  (this->err)._M_string_length = 0;
  (this->err).field_2._M_local_buf[0] = '\0';
  std::operator+(&local_b0,&this->file,":");
  std::__cxx11::to_string(&local_d0,this->line);
  std::operator+(&local_90,&local_b0,&local_d0);
  std::operator+(&local_70,&local_90," - ");
  std::operator+(&local_50,&local_70,&this->msg);
  std::__cxx11::string::operator=((string *)&this->err,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

al_exception(const std::string m, const std::string f, const int l) :
    msg(m), file(f), line(l) {
    err = file + ":" + std::to_string(line) + " - " + msg;
  }